

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O1

size_t sp_seg(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
             size_t *outbuf_left,size_t length)

{
  opencc_conversion_mode oVar1;
  size_t *psVar2;
  ucs4_t **ppuVar3;
  size_t sVar4;
  ucs4_t *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  int iVar8;
  ucs4_t *puVar9;
  size_t sVar10;
  ucs4_t uVar11;
  size_t *psVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  ucs4_t *puVar17;
  ucs4_t *puVar18;
  size_t match_len;
  size_t local_48;
  ucs4_t **local_40;
  size_t local_38;
  
  if (length != 1) {
    uVar14 = length + 1;
    if (((converter->spseg_buffer).initialized == 0) ||
       ((converter->spseg_buffer).buffer_size < uVar14)) {
      sp_seg_set_buffer_size(&converter->spseg_buffer,uVar14);
    }
    psVar12 = (converter->spseg_buffer).min_len;
    lVar15 = 0;
    do {
      psVar12[lVar15] = 0x7fffffff;
      lVar15 = lVar15 + 1;
    } while (length + 1 + (ulong)(uVar14 == 0) != lVar15);
    *(converter->spseg_buffer).parent = 0;
    *(converter->spseg_buffer).min_len = 0;
    if (length != 0) {
      sVar4 = 0;
      do {
        sVar13 = dictionary_group_get_all_match_lengths
                           (converter->current_dictionary_group,*inbuf + sVar4,
                            (converter->spseg_buffer).match_length);
        psVar12 = (converter->spseg_buffer).match_length;
        if (*psVar12 != 1) {
          psVar12[sVar13] = 1;
          sVar13 = sVar13 + 1;
        }
        if (sVar13 != 0) {
          sVar16 = 0;
          do {
            uVar14 = psVar12[sVar16];
            psVar12[sVar16] = 0;
            if (uVar14 < 2) {
LAB_00103d59:
              if (uVar14 == 1) {
                psVar2 = (converter->spseg_buffer).min_len;
                if (psVar2[sVar4] + 1 < psVar2[sVar4 + 1]) {
                  psVar2[sVar4 + 1] = psVar2[sVar4] + 1;
                  lVar15 = sVar4 + 1;
                  goto LAB_00103d7f;
                }
              }
            }
            else {
              psVar2 = (converter->spseg_buffer).min_len;
              lVar15 = uVar14 + sVar4;
              if (psVar2[lVar15] < psVar2[sVar4] + 1) goto LAB_00103d59;
              psVar2[lVar15] = psVar2[sVar4] + 1;
LAB_00103d7f:
              (converter->spseg_buffer).parent[lVar15] = sVar4;
            }
            sVar16 = sVar16 + 1;
          } while (sVar13 != sVar16);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != length);
      psVar2 = (converter->spseg_buffer).parent;
      psVar12 = (converter->spseg_buffer).path + (converter->spseg_buffer).min_len[length];
      sVar4 = length;
      do {
        psVar12 = psVar12 + -1;
        *psVar12 = sVar4;
        sVar4 = psVar2[sVar4];
      } while (sVar4 != 0);
    }
    sVar4 = *inbuf_left;
    if ((converter->spseg_buffer).min_len[length] != 0) {
      sVar13 = 0;
      uVar14 = 0;
      local_40 = inbuf;
      do {
        local_38 = (converter->spseg_buffer).path[uVar14];
        ppuVar3 = dictionary_group_match_longest
                            (converter->current_dictionary_group,*inbuf,local_38 - sVar13,&local_48)
        ;
        if (ppuVar3 == (ucs4_t **)0x0) {
          puVar5 = *outbuf;
          *puVar5 = **inbuf;
          *outbuf = puVar5 + 1;
          *outbuf_left = *outbuf_left - 1;
          puVar5 = *inbuf;
          ppuVar3 = inbuf;
          psVar12 = inbuf_left;
LAB_0010400f:
          *ppuVar3 = puVar5 + 1;
          *psVar12 = *psVar12 - 1;
LAB_00104019:
          iVar8 = 0;
          sVar13 = local_38;
        }
        else {
          oVar1 = converter->conversion_mode;
          if (oVar1 == OPENCC_CONVERSION_FAST) {
            puVar5 = *ppuVar3;
            sVar16 = ucs4len(puVar5);
            uVar6 = *outbuf_left;
            if (uVar6 < sVar16) {
              iVar8 = 0x1c;
              if (sVar4 == *inbuf_left) {
                errnum = CONVERTER_ERROR_OUTBUF;
                iVar8 = 1;
              }
            }
            else {
              uVar11 = *puVar5;
              if (uVar11 != 0) {
                puVar17 = *outbuf;
                sVar10 = *outbuf_left;
                do {
                  puVar5 = puVar5 + 1;
                  *puVar17 = uVar11;
                  puVar17 = puVar17 + 1;
                  sVar10 = sVar10 - 1;
                  uVar11 = *puVar5;
                } while (uVar11 != 0);
                *outbuf = puVar17;
                *outbuf_left = sVar10;
              }
              *inbuf = *inbuf + local_48;
              *inbuf_left = *inbuf_left - local_48;
              iVar8 = 0;
            }
            if (sVar16 <= uVar6) goto LAB_00104019;
          }
          else if (oVar1 == OPENCC_CONVERSION_SEGMENT_ONLY) {
            sVar16 = local_48;
            if (local_48 + 1 <= *outbuf_left) {
              for (; sVar16 != 0; sVar16 = sVar16 - 1) {
                puVar5 = *outbuf;
                *puVar5 = **inbuf;
                *outbuf = puVar5 + 1;
                *outbuf_left = *outbuf_left - 1;
                *inbuf = *inbuf + 1;
                *inbuf_left = *inbuf_left - 1;
              }
              puVar5 = *outbuf;
              *puVar5 = 0x20;
              ppuVar3 = outbuf;
              psVar12 = outbuf_left;
              goto LAB_0010400f;
            }
            iVar8 = 0x1c;
            if (sVar4 == *inbuf_left) {
              errnum = CONVERTER_ERROR_OUTBUF;
              iVar8 = 1;
            }
          }
          else {
            if (oVar1 != OPENCC_CONVERSION_LIST_CANDIDATES) {
              sp_seg_cold_1();
              goto LAB_00104298;
            }
            lVar15 = 0;
            do {
              puVar5 = ppuVar3[lVar15];
              if (puVar5 == (ucs4_t *)0x0) goto LAB_00103f01;
              puVar17 = ppuVar3[lVar15 + 1];
              sVar16 = ucs4len(puVar5);
              if (*outbuf_left < (sVar16 + 1) - (ulong)(puVar17 == (ucs4_t *)0x0)) {
                iVar8 = 0x22;
                if (sVar4 == *inbuf_left) {
                  errnum = CONVERTER_ERROR_OUTBUF;
                  iVar8 = 1;
                }
              }
              else {
                uVar11 = *puVar5;
                if (uVar11 != 0) {
                  puVar9 = *outbuf;
                  sVar16 = *outbuf_left;
                  do {
                    puVar5 = puVar5 + 1;
                    *puVar9 = uVar11;
                    puVar9 = puVar9 + 1;
                    sVar16 = sVar16 - 1;
                    uVar11 = *puVar5;
                  } while (uVar11 != 0);
                  *outbuf = puVar9;
                  *outbuf_left = sVar16;
                }
                iVar8 = 0;
                if (puVar17 != (ucs4_t *)0x0) {
                  puVar5 = *outbuf;
                  *puVar5 = 0x20;
                  *outbuf = puVar5 + 1;
                  *outbuf_left = *outbuf_left - 1;
                }
              }
              lVar15 = lVar15 + 1;
            } while (iVar8 == 0);
            if (iVar8 == 0x22) {
LAB_00103f01:
              *local_40 = *local_40 + local_48;
              *inbuf_left = *inbuf_left - local_48;
              iVar8 = 0;
            }
            inbuf = local_40;
            if (iVar8 == 0) goto LAB_00104019;
          }
        }
        if (iVar8 != 0) {
          if (iVar8 != 0x1c) {
            return 0xffffffffffffffff;
          }
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (converter->spseg_buffer).min_len[length]);
    }
    return sVar4 - *inbuf_left;
  }
  ppuVar3 = dictionary_group_match_longest
                      (converter->current_dictionary_group,*inbuf,1,(size_t *)0x0);
  oVar1 = converter->conversion_mode;
  if (oVar1 == OPENCC_CONVERSION_LIST_CANDIDATES) {
    if (ppuVar3 != (ucs4_t **)0x0) {
      lVar15 = 0;
      do {
        puVar5 = ppuVar3[lVar15];
        if (puVar5 == (ucs4_t *)0x0) {
          *inbuf = *inbuf + 1;
          *inbuf_left = *inbuf_left - 1;
          break;
        }
        puVar17 = ppuVar3[lVar15 + 1];
        sVar4 = ucs4len(puVar5);
        uVar6 = (sVar4 + 1) - (ulong)(puVar17 == (ucs4_t *)0x0);
        uVar14 = *outbuf_left;
        if (uVar14 < uVar6) {
          errnum = CONVERTER_ERROR_OUTBUF;
        }
        else {
          uVar11 = *puVar5;
          if (uVar11 != 0) {
            puVar9 = *outbuf;
            sVar4 = *outbuf_left;
            puVar18 = puVar5;
            do {
              puVar18 = puVar18 + 1;
              *puVar9 = uVar11;
              puVar9 = puVar9 + 1;
              sVar4 = sVar4 - 1;
              uVar11 = *puVar18;
            } while (uVar11 != 0);
            *outbuf = puVar9;
            *outbuf_left = sVar4;
          }
          if (puVar17 != (ucs4_t *)0x0) {
            puVar17 = *outbuf;
            *puVar17 = 0x20;
            *outbuf = puVar17 + 1;
            *outbuf_left = *outbuf_left - 1;
          }
        }
        lVar15 = lVar15 + 1;
      } while (uVar6 <= uVar14);
      if (puVar5 == (ucs4_t *)0x0) {
        return 1;
      }
      return 0xffffffffffffffff;
    }
  }
  else {
    if (oVar1 == OPENCC_CONVERSION_SEGMENT_ONLY) {
      if (ppuVar3 == (ucs4_t **)0x0) {
        puVar5 = *outbuf;
        *puVar5 = **inbuf;
        *outbuf = puVar5 + 1;
        uVar14 = *outbuf_left;
      }
      else {
        uVar14 = *outbuf_left;
        if (uVar14 < 2) {
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
        puVar5 = *outbuf;
        *puVar5 = **inbuf;
        *outbuf = puVar5 + 1;
      }
      *outbuf_left = uVar14 - 1;
      *inbuf = *inbuf + 1;
      *inbuf_left = *inbuf_left - 1;
      puVar5 = *outbuf;
      *puVar5 = 0x20;
      inbuf = outbuf;
      inbuf_left = outbuf_left;
      goto LAB_0010422e;
    }
    if (oVar1 != OPENCC_CONVERSION_FAST) {
LAB_00104298:
      sp_seg_cold_2();
      puVar7 = (undefined8 *)malloc(0x408);
      *puVar7 = 0;
      return (size_t)puVar7;
    }
    if (ppuVar3 != (ucs4_t **)0x0) {
      puVar5 = *ppuVar3;
      sVar4 = ucs4len(puVar5);
      uVar14 = *outbuf_left;
      if (uVar14 < sVar4) {
        errnum = CONVERTER_ERROR_OUTBUF;
      }
      else {
        uVar11 = *puVar5;
        if (uVar11 != 0) {
          puVar17 = *outbuf;
          sVar13 = *outbuf_left;
          do {
            puVar5 = puVar5 + 1;
            *puVar17 = uVar11;
            puVar17 = puVar17 + 1;
            sVar13 = sVar13 - 1;
            uVar11 = *puVar5;
          } while (uVar11 != 0);
          *outbuf = puVar17;
          *outbuf_left = sVar13;
        }
        *inbuf = *inbuf + 1;
        *inbuf_left = *inbuf_left - 1;
      }
      if (sVar4 <= uVar14) {
        return 1;
      }
      return 0xffffffffffffffff;
    }
  }
  puVar5 = *outbuf;
  *puVar5 = **inbuf;
  *outbuf = puVar5 + 1;
  *outbuf_left = *outbuf_left - 1;
  puVar5 = *inbuf;
LAB_0010422e:
  *inbuf = puVar5 + 1;
  *inbuf_left = *inbuf_left - 1;
  return 1;
}

Assistant:

static size_t sp_seg(converter_desc * converter, ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left, size_t length)
{
	/* 最短路徑分詞 */
	
	/* 對長度爲1時特殊優化 */
	if (length == 1)
	{
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				1,
				NULL
		);
		
		size_t match_len = 1;
		if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				const ucs4_t * result = match_rs[0];

				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (ucs4len(result) > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				for (; *result; result ++)
				{
					**outbuf = *result;
					(*outbuf) ++,(*outbuf_left) --;
				}

				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				size_t i;
				for (i = 0; match_rs[i] != NULL; i ++)
				{
					const ucs4_t * result = match_rs[i];
					int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) + show_delimiter > *outbuf_left)
					{
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					if (show_delimiter)
					{
						**outbuf = DELIMITER;
						(*outbuf) ++, (*outbuf_left) --;
					}
				}
				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (match_len + 1 > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				size_t i;
				for (i = 0; i < match_len; i ++)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
			}
			**outbuf = DELIMITER;
			(*outbuf) ++, (*outbuf_left) --;
		}
		else
			debug_should_not_be_here();
		/* 必須保證有一個字符空間 */
		return match_len;
	}
	
	/* 設置緩衝區空間 */
	spseg_buffer_desc * ossb = &(converter->spseg_buffer);
	size_t buffer_size_need = length + 1;
	if (ossb->initialized == FALSE || ossb->buffer_size < buffer_size_need)
		sp_seg_set_buffer_size(&(converter->spseg_buffer), buffer_size_need);
	
	size_t i, j;

	for (i = 0; i <= length; i ++)
		ossb->min_len[i] = INFINITY_INT;
	
	ossb->min_len[0] = ossb->parent[0] = 0;
	
	for (i = 0; i < length; i ++)
	{
		/* 獲取所有匹配長度 */
		size_t match_count = dictionary_group_get_all_match_lengths(
				converter->current_dictionary_group,
				(*inbuf) + i,
				ossb->match_length
		);
		
		if (ossb->match_length[0] != 1)
			ossb->match_length[match_count ++] = 1;
		
		/* 動態規劃求最短分割路徑 */
		for (j = 0; j < match_count; j ++)
		{
			size_t k = ossb->match_length[j];
			ossb->match_length[j] = 0;
			
			if (k > 1 && ossb->min_len[i] + 1 <= ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
			else if (k == 1 && ossb->min_len[i] + 1 < ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
		}
	}
	
	/* 取得最短分割路徑 */
	for (i = length, j = ossb->min_len[length]; i != 0; i = ossb->parent[i])
		ossb->path[--j] = i;
	
	size_t inbuf_left_start = *inbuf_left;
	size_t begin, end;

	/* 根據最短分割路徑轉換 */
	for (i = begin = 0; i < ossb->min_len[length]; i ++)
	{
		end = ossb->path[i];
		
		size_t match_len;
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				end - begin,
				&match_len
		);

		if (match_rs == NULL)
		{
			**outbuf = **inbuf;
			(*outbuf) ++, (*outbuf_left) --;
			(*inbuf) ++, (*inbuf_left) --;
		}
		else
		{
			if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					const ucs4_t * result = match_rs[0];

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					size_t i;
					for (i = 0; match_rs[i] != NULL; i ++)
					{
						const ucs4_t * result = match_rs[i];
						int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

						/* 輸出緩衝區剩餘空間小於分詞長度 */
						if (ucs4len(result) + show_delimiter > *outbuf_left)
						{
							if (inbuf_left_start - *inbuf_left > 0)
								break;
							errnum = CONVERTER_ERROR_OUTBUF;
							return (size_t) -1;
						}

						for (; *result; result ++)
						{
							**outbuf = *result;
							(*outbuf) ++,(*outbuf_left) --;
						}

						if (show_delimiter)
						{
							**outbuf = DELIMITER;
							(*outbuf) ++, (*outbuf_left) --;
						}
					}
					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (match_len + 1 > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					size_t i;
					for (i = 0; i < match_len; i ++)
					{
						**outbuf = **inbuf;
						(*outbuf) ++, (*outbuf_left) --;
						(*inbuf) ++, (*inbuf_left) --;
					}
				}
				**outbuf = DELIMITER;
				(*outbuf) ++, (*outbuf_left) --;
			}
			else
				debug_should_not_be_here();
		}
		
		begin = end;
	}
	
	return inbuf_left_start - *inbuf_left;
}